

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

DecodeStatus DecodetcGPRRegisterClass(MCInst *Inst,uint RegNo,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  
  DVar1 = MCDisassembler_Fail;
  if ((RegNo < 0xd) && ((0x120fU >> (RegNo & 0x1f) & 1) != 0)) {
    MCOperand_CreateReg0(Inst,*(uint *)(&DAT_0033b1f4 + (ulong)RegNo * 4));
    DVar1 = MCDisassembler_Success;
  }
  return DVar1;
}

Assistant:

static DecodeStatus DecodetcGPRRegisterClass(MCInst *Inst, unsigned RegNo,
		uint64_t Address, const void *Decoder)
{
	unsigned Register = 0;
	switch (RegNo) {
		case 0:
			Register = ARM_R0;
			break;
		case 1:
			Register = ARM_R1;
			break;
		case 2:
			Register = ARM_R2;
			break;
		case 3:
			Register = ARM_R3;
			break;
		case 9:
			Register = ARM_R9;
			break;
		case 12:
			Register = ARM_R12;
			break;
		default:
			return MCDisassembler_Fail;
	}

	MCOperand_CreateReg0(Inst, Register);
	return MCDisassembler_Success;
}